

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall FBX::Parser::~Parser(Parser *this)

{
  bool bVar1;
  reference ppPVar2;
  Process **process;
  iterator __end1;
  iterator __begin1;
  set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_> *__range1;
  Parser *this_local;
  
  __end1 = std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::
           begin(&this->processes);
  process = (Process **)
            std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::
            end(&this->processes);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&process);
    if (!bVar1) break;
    ppPVar2 = std::_Rb_tree_const_iterator<FBX::Process_*>::operator*(&__end1);
    if (*ppPVar2 != (Process *)0x0) {
      (*(*ppPVar2)->_vptr_Process[1])();
    }
    std::_Rb_tree_const_iterator<FBX::Process_*>::operator++(&__end1);
  }
  std::set<FBX::Process_*,_std::less<FBX::Process_*>,_std::allocator<FBX::Process_*>_>::~set
            (&this->processes);
  return;
}

Assistant:

Parser::~Parser() {
        for (auto &process : processes)
            delete process;
    }